

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

void __thiscall
math::wide_integer::uintwide_t<11264U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
shl<unsigned_int>(uintwide_t<11264U,_unsigned_int,_std::allocator<unsigned_int>,_false> *this,uint n
                 )

{
  uint uVar1;
  const_iterator first;
  const_iterator it;
  uint *puVar2;
  iterator pvVar3;
  uint *dest;
  iterator it_00;
  byte bVar4;
  local_integral_type right_shift_previous_value;
  uint *puStack_48;
  uint t;
  uint *ai;
  limb_type part_from_previous_value;
  unsigned_fast_type left_shift_amount;
  ulong local_28;
  unsigned_long local_20;
  unsigned_long offset;
  uintwide_t<11264U,_unsigned_int,_std::allocator<unsigned_int>,_false> *puStack_10;
  uint n_local;
  uintwide_t<11264U,_unsigned_int,_std::allocator<unsigned_int>,_false> *this_local;
  
  local_28 = (ulong)(n >> 5);
  left_shift_amount = 0x160;
  offset._4_4_ = n;
  puStack_10 = this;
  local_20 = detail::min_unsafe<unsigned_long>(&local_28,&left_shift_amount);
  uVar1 = offset._4_4_ & 0x1f;
  bVar4 = (byte)offset._4_4_ & 0x1f;
  if (local_20 != 0) {
    first = util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
            cbegin((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                   this);
    it = util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::cbegin
                   ((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                    this);
    puVar2 = detail::advance_and_point<unsigned_int_const*,unsigned_int>(it,0x160 - (int)local_20);
    pvVar3 = util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
             begin((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                   this);
    dest = detail::advance_and_point<unsigned_int*,unsigned_int>(pvVar3,0x160);
    detail::copy_backward_unsafe<unsigned_int_const*,unsigned_int*>(first,puVar2,dest);
    pvVar3 = util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
             begin((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                   this);
    it_00 = util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
            begin((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                  this);
    puVar2 = detail::advance_and_point<unsigned_int*,unsigned_int>(it_00,(uint)local_20);
    detail::fill_unsafe<unsigned_int*,unsigned_int>(pvVar3,puVar2,0);
  }
  if (uVar1 != 0) {
    ai._4_4_ = 0;
    pvVar3 = util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
             begin((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                   this);
    puStack_48 = detail::advance_and_point<unsigned_int*,unsigned_long>(pvVar3,local_20);
    while (pvVar3 = util::
                    dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                    end((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                         *)this), puStack_48 != pvVar3) {
      uVar1 = *puStack_48;
      *puStack_48 = uVar1 << bVar4 | ai._4_4_;
      ai._4_4_ = uVar1 >> (0x20 - bVar4 & 0x1f);
      puStack_48 = puStack_48 + 1;
    }
  }
  return;
}

Assistant:

constexpr auto shl(IntegralType n) -> void
    {
      const auto offset =
        (detail::min_unsafe)(static_cast<unsigned_fast_type>(static_cast<unsigned_fast_type>(n) / static_cast<unsigned_fast_type>(std::numeric_limits<limb_type>::digits)),
                             static_cast<unsigned_fast_type>(number_of_limbs));

      const auto left_shift_amount = static_cast<unsigned_fast_type>(static_cast<unsigned_fast_type>(n) % static_cast<unsigned_fast_type>(std::numeric_limits<limb_type>::digits));

      if(offset > static_cast<unsigned_fast_type>(UINT8_C(0)))
      {
        detail::copy_backward_unsafe(values.cbegin(),
                                     detail::advance_and_point(values.cbegin(), static_cast<size_t>(number_of_limbs - offset)),
                                     detail::advance_and_point(values.begin(), static_cast<size_t>(number_of_limbs)));

        detail::fill_unsafe(values.begin(), detail::advance_and_point(values.begin(), static_cast<size_t>(offset)), static_cast<limb_type>(UINT8_C(0)));
      }

      using local_integral_type = unsigned_fast_type;

      if(left_shift_amount != static_cast<local_integral_type>(UINT8_C(0)))
      {
        auto part_from_previous_value = static_cast<limb_type>(UINT8_C(0));

        auto ai = detail::advance_and_point(values.begin(), offset); // NOLINT(llvm-qualified-auto,readability-qualified-auto)

        while(ai != values.end()) // NOLINT(altera-id-dependent-backward-branch)
        {
          const auto t = *ai;

          *ai++ =
            static_cast<limb_type>
            (
                static_cast<limb_type>(t << static_cast<local_integral_type>(left_shift_amount))
              | part_from_previous_value
            );

          const auto right_shift_previous_value =
            static_cast<local_integral_type>
            (
              static_cast<unsigned_fast_type>
              (
                  static_cast<std::int_fast32_t>(std::numeric_limits<limb_type>::digits)
                - static_cast<std::int_fast32_t>(left_shift_amount)
              )
            );

          part_from_previous_value = static_cast<limb_type>(t >> right_shift_previous_value);
        }
      }
    }